

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

double anon_unknown.dwarf_b837c::ParseDouble(ExpressionContext *ctx,char *str)

{
  char cVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double power;
  double dVar5;
  
  dVar3 = 0.0;
  while( true ) {
    cVar1 = (char)ctx->optimizationLevel;
    if (9 < (int)cVar1 - 0x30U) break;
    dVar3 = dVar3 * 10.0 + (double)(int)((int)cVar1 - 0x30U);
    ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
  }
  dVar4 = 0.0;
  if (cVar1 == '.') {
    dVar5 = 0.1;
    while( true ) {
      ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
      cVar1 = (char)ctx->optimizationLevel;
      if (9 < (int)cVar1 - 0x30U) break;
      dVar4 = dVar4 + (double)(int)((int)cVar1 - 0x30U) * dVar5;
      dVar5 = dVar5 / 10.0;
    }
  }
  if (cVar1 == 'e') {
    if (*(char *)((long)&ctx->optimizationLevel + 1) == '-') {
      iVar2 = ParseInteger((ExpressionContext *)((long)&ctx->optimizationLevel + 2),str);
      iVar2 = -iVar2;
    }
    else {
      iVar2 = ParseInteger((ExpressionContext *)((long)&ctx->optimizationLevel + 1),str);
    }
    dVar5 = pow(10.0,(double)iVar2);
    dVar5 = (dVar3 + dVar4) * dVar5;
  }
  else {
    dVar5 = dVar3 + dVar4;
  }
  return dVar5;
}

Assistant:

double ParseDouble(ExpressionContext &ctx, const char *str)
	{
		unsigned digit;
		double integer = 0.0;

		while((digit = *str - '0') < 10)
		{
			integer = integer * 10.0 + digit;
			str++;
		}

		double fractional = 0.0;
	
		if(*str == '.')
		{
			double power = 0.1;
			str++;

			while((digit = *str - '0') < 10)
			{
				fractional = fractional + power * digit;
				power /= 10.0;
				str++;
			}
		}

		if(*str == 'e')
		{
			str++;

			if(*str == '-')
				return (integer + fractional) * pow(10.0, (double)-ParseInteger(ctx, str + 1));
			else
				return (integer + fractional) * pow(10.0, (double)ParseInteger(ctx, str));
		}

		return integer + fractional;
	}